

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O1

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,uint n)

{
  byte bVar1;
  byte *pbVar2;
  StringBuffer *pSVar3;
  byte *__n;
  byte *pbVar4;
  undefined8 in_RDX;
  bool bVar5;
  char fbuf [64];
  byte local_48 [72];
  
  pbVar2 = local_48;
  if (n != 0) {
    in_RDX = 0xcccccccd;
    pbVar2 = local_48;
    do {
      *pbVar2 = (char)n + (char)(n / 10) * -10 | 0x30;
      pbVar2 = pbVar2 + 1;
      bVar5 = 9 < n;
      n = n / 10;
    } while (bVar5);
  }
  if (pbVar2 == local_48) {
    *pbVar2 = 0x30;
    pbVar2 = pbVar2 + 1;
  }
  *pbVar2 = 0;
  bVar5 = pbVar2 != local_48;
  pbVar2 = pbVar2 + -1;
  __n = (byte *)CONCAT71((int7)((ulong)local_48 >> 8),local_48 < pbVar2 && bVar5);
  pbVar4 = (byte *)CONCAT71((int7)((ulong)in_RDX >> 8),bVar5);
  if (local_48 < pbVar2 && bVar5) {
    pbVar4 = local_48 + 1;
    do {
      bVar1 = pbVar4[-1];
      pbVar4[-1] = *pbVar2;
      *pbVar2 = bVar1;
      pbVar2 = pbVar2 + -1;
      __n = pbVar4 + 1;
      bVar5 = pbVar4 < pbVar2;
      pbVar4 = __n;
    } while (bVar5);
  }
  pSVar3 = (StringBuffer *)write(this,(int)local_48,pbVar4,(size_t)__n);
  return pSVar3;
}

Assistant:

StringBuffer& operator<<(unsigned int n)       { _UITOA(n); }